

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

void ly_ctx_destroy(ly_ctx *ctx,_func_void_lys_node_ptr_void_ptr *private_destructor)

{
  uint uVar1;
  char **__ptr;
  long lVar2;
  
  if (ctx != (ly_ctx *)0x0) {
    uVar1 = (ctx->models).used;
    while (0 < (int)uVar1) {
      lys_sub_module_remove_devs_augs((ctx->models).list[(ulong)uVar1 - 1]);
      lys_free((ctx->models).list[(long)(ctx->models).used + -1],private_destructor,1,0);
      uVar1 = (ctx->models).used - 1;
      (ctx->models).used = uVar1;
    }
    __ptr = (ctx->models).search_paths;
    if (__ptr != (char **)0x0) {
      lVar2 = 0;
      while (*(void **)((long)__ptr + lVar2) != (void *)0x0) {
        free(*(void **)((long)__ptr + lVar2));
        lVar2 = lVar2 + 8;
        __ptr = (ctx->models).search_paths;
      }
      free(__ptr);
    }
    free((ctx->models).list);
    ly_err_clean(ctx,(ly_err_item *)0x0);
    pthread_key_delete(ctx->errlist_key);
    lydict_clean(&ctx->dict);
    ly_clean_plugins();
    free(ctx);
    return;
  }
  return;
}

Assistant:

API void
ly_ctx_destroy(struct ly_ctx *ctx, void (*private_destructor)(const struct lys_node *node, void *priv))
{
    int i;

    if (!ctx) {
        return;
    }

    /* models list */
    for (; ctx->models.used > 0; ctx->models.used--) {
        /* remove the applied deviations and augments */
        lys_sub_module_remove_devs_augs(ctx->models.list[ctx->models.used - 1]);
        /* remove the module */
        lys_free(ctx->models.list[ctx->models.used - 1], private_destructor, 1, 0);
    }
    if (ctx->models.search_paths) {
        for(i = 0; ctx->models.search_paths[i]; i++) {
            free(ctx->models.search_paths[i]);
        }
        free(ctx->models.search_paths);
    }
    free(ctx->models.list);

    /* clean the error list */
    ly_err_clean(ctx, 0);
    pthread_key_delete(ctx->errlist_key);

    /* dictionary */
    lydict_clean(&ctx->dict);

    /* plugins - will be removed only if this is the last context */
    ly_clean_plugins();

    free(ctx);
}